

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = h->aud->primary_pic_type;
  uVar4 = 2;
  do {
    iVar3 = b->bits_left + -1;
    b->bits_left = iVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((uVar1 >> (uVar4 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar5 = uVar4 != 0;
    uVar4 = uVar4 - 1;
  } while (bVar5);
  return;
}

Assistant:

void write_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    bs_write_u(b, 3, h->aud->primary_pic_type);
}